

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_typename.cpp
# Opt level: O1

vector<duckdb::Value,_true> * __thiscall
duckdb::Transformer::TransformTypeModifiers
          (vector<duckdb::Value,_true> *__return_storage_ptr__,Transformer *this,
          PGTypeName *type_name)

{
  ParserOptions *pPVar1;
  pointer pCVar2;
  ParserException *pPVar3;
  PGListCell *pPVar4;
  PGValue val;
  unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
  const_expr;
  undefined1 local_50 [32];
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((type_name->typmods != (PGList *)0x0) &&
     (pPVar4 = type_name->typmods->head, pPVar4 != (PGListCell *)0x0)) {
    do {
      if (0x240 < (ulong)((long)(__return_storage_ptr__->
                                super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->
                               super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start)) {
        local_50._0_8_ = (type_name->names->tail->data).ptr_value;
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_50);
        pPVar1 = *(ParserOptions **)(local_50._0_8_ + 8);
        pPVar3 = (ParserException *)__cxa_allocate_exception(0x10);
        local_50._0_8_ = (Transformer *)(local_50 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"\'%s\': a maximum of 9 type modifiers is allowed","");
        ParserException::ParserException<char>
                  (pPVar3,(string *)local_50,pPVar1->preserve_identifier_case);
        __cxa_throw(pPVar3,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_50._0_8_ = (pPVar4->data).ptr_value;
      optional_ptr<duckdb_libpgquery::PGAConst,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)local_50);
      if (*(int *)local_50._0_8_ != 0x164) {
        pPVar3 = (ParserException *)__cxa_allocate_exception(0x10);
        local_50._0_8_ = local_50 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Expected a constant as type modifier","");
        ParserException::ParserException(pPVar3,(string *)local_50);
        __cxa_throw(pPVar3,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      val.val.ival._0_4_ = *(int *)(local_50._0_8_ + 8);
      val._0_8_ = this;
      val.val.ival._4_4_ = 0;
      TransformValue((Transformer *)local_50,val);
      pCVar2 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
               ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                             *)local_50);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__return_storage_ptr__,
                 &pCVar2->value);
      if ((Transformer *)local_50._0_8_ != (Transformer *)0x0) {
        (**(code **)(*(long *)local_50._0_8_ + 8))();
      }
      pPVar4 = pPVar4->next;
    } while (pPVar4 != (PGListCell *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Value> Transformer::TransformTypeModifiers(duckdb_libpgquery::PGTypeName &type_name) {
	vector<Value> type_mods;
	if (type_name.typmods) {
		for (auto node = type_name.typmods->head; node; node = node->next) {
			if (type_mods.size() > 9) {
				const auto &name =
				    *PGPointerCast<duckdb_libpgquery::PGValue>(type_name.names->tail->data.ptr_value)->val.str;
				throw ParserException("'%s': a maximum of 9 type modifiers is allowed", name);
			}
			const auto &const_val = *PGPointerCast<duckdb_libpgquery::PGAConst>(node->data.ptr_value);
			if (const_val.type != duckdb_libpgquery::T_PGAConst) {
				throw ParserException("Expected a constant as type modifier");
			}
			const auto const_expr = TransformValue(const_val.val);
			type_mods.push_back(std::move(const_expr->value));
		}
	}
	return type_mods;
}